

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O3

void __thiscall Assimp::D3DS::Mesh::~Mesh(Mesh *this)

{
  pointer puVar1;
  pointer paVar2;
  pointer pcVar3;
  pointer pFVar4;
  
  puVar1 = (this->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  paVar2 = (this->mTexCoords).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2);
  }
  pcVar3 = (this->mName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->mName).field_2) {
    operator_delete(pcVar3);
  }
  paVar2 = (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mNormals.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2);
  }
  pFVar4 = (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
           super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pFVar4 != (pointer)0x0) {
    operator_delete(pFVar4);
  }
  paVar2 = (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2);
    return;
  }
  return;
}

Assistant:

Mesh() = delete;